

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::resetOnNewSessionFixture::resetOnNewSessionFixture
          (resetOnNewSessionFixture *this)

{
  UtcTimeOnly *this_00;
  int64_t iVar1;
  sessionFixture *psVar2;
  sessionFixture *psVar3;
  undefined4 uVar4;
  
  acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_003261e8;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__resetOnNewSessionFixture_00326240;
  this_00 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime;
  FIX::UtcTimeOnly::setCurrent(this_00);
  psVar2 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar4 = *(undefined4 *)&(psVar2->super_TestCallback).startTime.super_DateTime.field_0xc;
  iVar1 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
          super_DateTime.m_time;
  psVar3 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar3->super_TestCallback).endTime.super_DateTime.m_date =
       (psVar2->super_TestCallback).startTime.super_DateTime.m_date;
  *(undefined4 *)&(psVar3->super_TestCallback).endTime.super_DateTime.field_0xc = uVar4;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = iVar1;
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
              super_DateTime,2);
  FIX::DateTime::operator+=(&this_00->super_DateTime,-2);
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

resetOnNewSessionFixture()
  {
    startTime.setCurrent();
    endTime = startTime;
    endTime += 2;
    startTime += -2;

    acceptorFixture::createSession( 0 );
  }